

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

bool __thiscall despot::TabularCPT::Validate(TabularCPT *this)

{
  value_type this_00;
  int iVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  const_reference ppNVar5;
  string *psVar6;
  reference pvVar7;
  char *pcVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  uint local_64;
  int local_60;
  int i_1;
  int i;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> index;
  double dStack_30;
  int c;
  double sum;
  int p;
  int child_size;
  int parent_size;
  TabularCPT *this_local;
  
  iVar1 = (*(this->super_CPT).super_Function._vptr_Function[7])();
  iVar2 = (*(this->super_CPT).super_Function._vptr_Function[9])();
  sum._4_4_ = 0;
  while( true ) {
    if (iVar1 <= (int)sum._4_4_) {
      return true;
    }
    dStack_30 = 0.0;
    for (index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        (int)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ < iVar2;
        index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1) {
      (*(this->super_CPT).super_Function._vptr_Function[4])
                (this,(ulong)sum._4_4_,
                 (ulong)index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_);
      dStack_30 = extraout_XMM0_Qa + dStack_30;
    }
    if (1e-06 < ABS(dStack_30 - 1.0)) break;
    sum._4_4_ = sum._4_4_ + 1;
  }
  Variable::ComputeIndexVec
            ((vector<int,_std::allocator<int>_> *)local_50,
             &(this->super_CPT).super_Function.parents_,sum._4_4_);
  std::operator<<((ostream *)&std::cerr,"ERROR: Probabilities do not sum to one when parents = [");
  for (local_60 = 0;
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_50),
      (ulong)(long)local_60 < sVar3; local_60 = local_60 + 1) {
    pcVar8 = ", ";
    if (local_60 == 0) {
      pcVar8 = "";
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar8);
    ppNVar5 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                        (&(this->super_CPT).super_Function.parents_,(long)local_60);
    psVar6 = NamedVar::name_abi_cxx11_(*ppNVar5);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4,"=");
    ppNVar5 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                        (&(this->super_CPT).super_Function.parents_,(long)local_60);
    this_00 = *ppNVar5;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_50,(long)local_60);
    psVar6 = Variable::GetValue_abi_cxx11_(&this_00->super_Variable,*pvVar7);
    std::operator<<(poVar4,(string *)psVar6);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cerr," Sum = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dStack_30);
  std::operator<<(poVar4,"; Entries: [");
  for (local_64 = 0; (int)local_64 < iVar2; local_64 = local_64 + 1) {
    pcVar8 = ", ";
    if (local_64 == 0) {
      pcVar8 = "";
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar8);
    psVar6 = Variable::GetValue_abi_cxx11_
                       (&((this->super_CPT).super_Function.child_)->super_Variable,local_64);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4,"=");
    (*(this->super_CPT).super_Function._vptr_Function[4])(this,(ulong)sum._4_4_,(ulong)local_64);
    std::ostream::operator<<(poVar4,extraout_XMM0_Qa_00);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  return false;
}

Assistant:

bool TabularCPT::Validate() const {
	int parent_size = ParentSize(), child_size = ChildSize();

	for (int p = 0; p < parent_size; p++) {
		double sum = 0;
		for (int c = 0; c < child_size; c++) {
			sum += GetValue(p, c);
		}

		if (fabs(sum - 1.0) > 1e-6) {
			vector<int> index = Variable::ComputeIndexVec(parents_, p);
			cerr << "ERROR: Probabilities do not sum to one when parents = [";
			for (int i = 0; i < index.size(); i++) {
				cerr << (i == 0 ? "" : ", ") << parents_[i]->name() << "="
					<< parents_[i]->GetValue(index[i]);
			}
			cerr << "]" << endl;

			cerr << " Sum = " << sum << "; Entries: [";
			for (int i = 0; i < child_size; i++) {
				cerr << (i == 0 ? "" : ", ") << child_->GetValue(i) << "="
					<< GetValue(p, i);
			}
			cerr << "]" << endl;

			return false;
		}
	}

	return true;
}